

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PollerPoll.cpp
# Opt level: O1

void __thiscall
Liby::PollerPoll::updateChanel(PollerPoll *this,Channel *ch,bool readable,bool writable)

{
  undefined2 uVar1;
  pointer ppVar2;
  long lVar3;
  
  if ((ch != (Channel *)0x0) && (lVar3 = (long)ch->fd_, -1 < lVar3)) {
    ppVar2 = (this->pollfds_).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar1 = ppVar2[lVar3].events;
    ppVar2[lVar3].events = ((ushort)readable | uVar1 & 0xfffa) + (ushort)writable * 4;
    return;
  }
  __assert_fail("ch && ch->get_fd() >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/PollerPoll.cpp"
                ,0x21,"virtual void Liby::PollerPoll::updateChanel(Channel *, bool, bool)");
}

Assistant:

void PollerPoll::updateChanel(Channel *ch, bool readable, bool writable) {
    assert(ch && ch->get_fd() >= 0);

    int fd = ch->get_fd();
    struct pollfd *p = &pollfds_[fd];

    if (readable) {
        p->events |= POLLIN;
    } else {
        p->events &= ~POLLIN;
    }

    if (writable) {
        p->events |= POLLOUT;
    } else {
        p->events &= ~POLLOUT;
    }
}